

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::ToolBarLayout(ToolBarLayout *this,QWidget *parent)

{
  QWidget *parent_local;
  ToolBarLayout *this_local;
  
  QLayout::QLayout(&this->super_QLayout,parent);
  *(undefined ***)this = &PTR_metaObject_00236988;
  *(undefined ***)&this->field_0x10 = &PTR__ToolBarLayout_00236a98;
  this->left = (QWidgetItem *)0x0;
  this->right = (QWidgetItem *)0x0;
  QList<QLayoutItem_*>::QList(&this->buttons);
  this->orient = Horizontal;
  QFlags<Qt::AlignmentFlag>::QFlags(&this->align,AlignLeading);
  this->offset = 0;
  return;
}

Assistant:

ToolBarLayout::ToolBarLayout( QWidget * parent )
	:	QLayout( parent )
	,	left( 0 )
	,	right( 0 )
	,	orient( Qt::Horizontal )
	,	align( Qt::AlignLeft )
	,	offset( 0 )
{
}